

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *f2;
  reference pcVar5;
  pointer pcVar6;
  string *psVar7;
  char *pcVar8;
  ostream *poVar9;
  PolicyID id;
  bool local_7f3;
  bool local_7f2;
  bool local_7de;
  bool local_7bf;
  bool local_7bd;
  bool local_79f;
  bool local_79d;
  bool local_783;
  bool local_781;
  bool local_769;
  bool local_6f1;
  string local_6e8;
  string local_6c8;
  undefined1 local_6a8 [8];
  ostringstream e;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_520;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_518;
  allocator local_509;
  string local_508;
  undefined1 local_4e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  iterator iStack_4c8;
  bool result_3;
  _Self local_4c0;
  undefined1 local_4b5;
  int local_4b4;
  bool success;
  iterator iStack_4b0;
  int fileIsNewer;
  _Self local_4a8;
  undefined1 local_49d;
  CompareOp local_49c;
  bool result_2;
  iterator iStack_498;
  CompareOp op;
  _Self local_490;
  bool local_485;
  int local_484;
  bool result_1;
  iterator iStack_480;
  int val;
  _Self local_478;
  bool local_469;
  double dStack_468;
  bool result;
  double rhs;
  double lhs;
  _Self local_450;
  _List_node_base *local_448;
  const_iterator local_440;
  allocator local_431;
  string local_430;
  cmExpandedCommandArgument local_410;
  _Self local_3e8;
  _List_node_base *local_3e0;
  const_iterator local_3d8;
  _List_node_base *local_3d0;
  const_iterator local_3c8;
  allocator local_3b9;
  string local_3b8;
  cmExpandedCommandArgument local_398;
  allocator local_369;
  string local_368;
  cmExpandedCommandArgument local_348;
  int local_31c;
  string local_318 [32];
  undefined1 local_2f8 [8];
  ostringstream error;
  undefined1 local_180 [8];
  RegularExpression regEntry;
  char *rex;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _List_iterator<cmExpandedCommandArgument> local_80;
  iterator argP2;
  iterator argP1;
  iterator arg;
  char *def2;
  char *def;
  string def_buf;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  std::__cxx11::string::string((string *)&def);
  do {
    def_buf.field_2._12_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_80);
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP1,&local_88);
      if (!bVar2) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_80);
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_90);
      local_6f1 = false;
      if (bVar2) {
        local_98._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        bVar2 = std::operator!=(&local_80,&local_98);
        local_6f1 = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_6f1 = IsKeyword(this,&keyMATCHES_abi_cxx11_,pcVar5);
        }
      }
      if (local_6f1 != false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        pcVar8 = GetVariableOrString(this,pcVar5);
        def2 = pcVar8;
        pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
        pcVar4 = cmExpandedCommandArgument::c_str(pcVar6);
        if (pcVar8 != pcVar4) {
          pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
          psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar6);
          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,13ul>
                            (psVar7,(char (*) [13])"CMAKE_MATCH_");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&def,def2);
            def2 = (char *)std::__cxx11::string::c_str();
          }
        }
        pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
        regEntry.searchstring = cmExpandedCommandArgument::c_str(pcVar6);
        cmMakefile::ClearMatches(this->Makefile);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_180);
        bVar2 = cmsys::RegularExpression::compile
                          ((RegularExpression *)local_180,regEntry.searchstring);
        if (bVar2) {
          bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_180,def2);
          if (bVar2) {
            cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_180);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_368,"1",&local_369);
            cmExpandedCommandArgument::cmExpandedCommandArgument(&local_348,&local_368,true);
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
            cmExpandedCommandArgument::operator=(pcVar5,&local_348);
            cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_348);
            std::__cxx11::string::~string((string *)&local_368);
            std::allocator<char>::~allocator((allocator<char> *)&local_369);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_3b8,"0",&local_3b9);
            cmExpandedCommandArgument::cmExpandedCommandArgument(&local_398,&local_3b8,true);
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
            cmExpandedCommandArgument::operator=(pcVar5,&local_398);
            cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
          }
          std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                    (&local_3c8,&local_80);
          local_3d0 = (_List_node_base *)
                      std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      erase(newArgs,local_3c8);
          std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                    (&local_3d8,&argP2);
          local_3e0 = (_List_node_base *)
                      std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      erase(newArgs,local_3d8);
          argP2 = argP1;
          IncrementArguments(this,newArgs,&argP2,&local_80);
          def_buf.field_2._12_4_ = 1;
          local_31c = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
          poVar9 = std::operator<<((ostream *)local_2f8,"Regular expression \"");
          poVar9 = std::operator<<(poVar9,regEntry.searchstring);
          std::operator<<(poVar9,"\" cannot compile");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)errorString,local_318);
          std::__cxx11::string::~string(local_318);
          *status = FATAL_ERROR;
          this_local._7_1_ = 0;
          local_31c = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_180);
        if (local_31c != 0) goto LAB_0089566b;
      }
      local_3e8._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_3e8);
      local_769 = false;
      if (bVar2) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        local_769 = IsKeyword(this,&keyMATCHES_abi_cxx11_,pcVar5);
      }
      if (local_769 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_430,"0",&local_431);
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_410,&local_430,true);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        cmExpandedCommandArgument::operator=(pcVar5,&local_410);
        cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_440,&argP2);
        local_448 = (_List_node_base *)
                    std::__cxx11::
                    list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    erase(newArgs,local_440);
        argP2 = argP1;
        IncrementArguments(this,newArgs,&argP2,&local_80);
        def_buf.field_2._12_4_ = 1;
      }
      local_450._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_450);
      local_781 = false;
      if (bVar2) {
        lhs = (double)std::__cxx11::
                      list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                      end(newArgs);
        bVar2 = std::operator!=(&local_80,(_Self *)&lhs);
        local_781 = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = IsKeyword(this,&keyLESS_abi_cxx11_,pcVar5);
          local_783 = true;
          if (!bVar2) {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = IsKeyword(this,&keyLESS_EQUAL_abi_cxx11_,pcVar5);
            local_783 = true;
            if (!bVar2) {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = IsKeyword(this,&keyGREATER_abi_cxx11_,pcVar5);
              local_783 = true;
              if (!bVar2) {
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                bVar2 = IsKeyword(this,&keyGREATER_EQUAL_abi_cxx11_,pcVar5);
                local_783 = true;
                if (!bVar2) {
                  pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                  local_783 = IsKeyword(this,&keyEQUAL_abi_cxx11_,pcVar5);
                }
              }
            }
          }
          local_781 = local_783;
        }
      }
      if (local_781 != false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar5);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar8 = GetVariableOrString(this,pcVar5);
        iVar3 = __isoc99_sscanf(def2,"%lg",&rhs);
        if ((iVar3 == 1) &&
           (iVar3 = __isoc99_sscanf(pcVar8,"%lg",&stack0xfffffffffffffb98), iVar3 == 1)) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyLESS_abi_cxx11_);
          if (bVar2) {
            local_469 = rhs < dStack_468;
          }
          else {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyLESS_EQUAL_abi_cxx11_);
            if (bVar2) {
              local_469 = rhs <= dStack_468;
            }
            else {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyGREATER_abi_cxx11_);
              if (bVar2) {
                local_469 = dStack_468 < rhs;
              }
              else {
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyGREATER_EQUAL_abi_cxx11_);
                if (bVar2) {
                  local_469 = dStack_468 <= rhs;
                }
                else {
                  local_469 = rhs == dStack_468;
                }
              }
            }
          }
        }
        else {
          local_469 = false;
        }
        HandleBinaryOp(this,local_469,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_478._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_478);
      local_79d = false;
      if (bVar2) {
        iStack_480 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        bVar2 = std::operator!=(&local_80,&stack0xfffffffffffffb80);
        local_79d = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = IsKeyword(this,&keySTRLESS_abi_cxx11_,pcVar5);
          local_79f = true;
          if (!bVar2) {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = IsKeyword(this,&keySTRLESS_EQUAL_abi_cxx11_,pcVar5);
            local_79f = true;
            if (!bVar2) {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = IsKeyword(this,&keySTRGREATER_abi_cxx11_,pcVar5);
              local_79f = true;
              if (!bVar2) {
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                bVar2 = IsKeyword(this,&keySTRGREATER_EQUAL_abi_cxx11_,pcVar5);
                local_79f = true;
                if (!bVar2) {
                  pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                  local_79f = IsKeyword(this,&keySTREQUAL_abi_cxx11_,pcVar5);
                }
              }
            }
          }
          local_79d = local_79f;
        }
      }
      if (local_79d != false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar5);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar8 = GetVariableOrString(this,pcVar5);
        local_484 = strcmp(def2,pcVar8);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keySTRLESS_abi_cxx11_);
        if (bVar2) {
          local_485 = local_484 < 0;
        }
        else {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keySTRLESS_EQUAL_abi_cxx11_);
          if (bVar2) {
            local_485 = local_484 < 1;
          }
          else {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keySTRGREATER_abi_cxx11_);
            if (bVar2) {
              local_485 = 0 < local_484;
            }
            else {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keySTRGREATER_EQUAL_abi_cxx11_);
              if (bVar2) {
                local_485 = -1 < local_484;
              }
              else {
                local_485 = local_484 == 0;
              }
            }
          }
        }
        HandleBinaryOp(this,local_485,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_490._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_490);
      local_7bd = false;
      if (bVar2) {
        iStack_498 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        bVar2 = std::operator!=(&local_80,&stack0xfffffffffffffb68);
        local_7bd = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = IsKeyword(this,&keyVERSION_LESS_abi_cxx11_,pcVar5);
          local_7bf = true;
          if (!bVar2) {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = IsKeyword(this,&keyVERSION_LESS_EQUAL_abi_cxx11_,pcVar5);
            local_7bf = true;
            if (!bVar2) {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = IsKeyword(this,&keyVERSION_GREATER_abi_cxx11_,pcVar5);
              local_7bf = true;
              if (!bVar2) {
                pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                bVar2 = IsKeyword(this,&keyVERSION_GREATER_EQUAL_abi_cxx11_,pcVar5);
                local_7bf = true;
                if (!bVar2) {
                  pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
                  local_7bf = IsKeyword(this,&keyVERSION_EQUAL_abi_cxx11_,pcVar5);
                }
              }
            }
          }
          local_7bd = local_7bf;
        }
      }
      if (local_7bd != false) {
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        def2 = GetVariableOrString(this,pcVar5);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_80);
        pcVar8 = GetVariableOrString(this,pcVar5);
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
        bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyVERSION_LESS_abi_cxx11_);
        if (bVar2) {
          local_49c = OP_LESS;
        }
        else {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyVERSION_LESS_EQUAL_abi_cxx11_);
          if (bVar2) {
            local_49c = OP_LESS_EQUAL;
          }
          else {
            pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
            bVar2 = cmExpandedCommandArgument::operator==(pcVar5,&keyVERSION_GREATER_abi_cxx11_);
            if (bVar2) {
              local_49c = OP_GREATER;
            }
            else {
              pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
              bVar2 = cmExpandedCommandArgument::operator==
                                (pcVar5,&keyVERSION_GREATER_EQUAL_abi_cxx11_);
              if (bVar2) {
                local_49c = OP_GREATER_EQUAL;
              }
              else {
                local_49c = OP_EQUAL;
              }
            }
          }
        }
        local_49d = cmSystemTools::VersionCompare(local_49c,def2,pcVar8);
        HandleBinaryOp(this,(bool)local_49d,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,
                       newArgs,&argP2,&local_80);
      }
      local_4a8._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_4a8);
      local_7de = false;
      if (bVar2) {
        iStack_4b0 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        bVar2 = std::operator!=(&local_80,&stack0xfffffffffffffb50);
        local_7de = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_7de = IsKeyword(this,&keyIS_NEWER_THAN_abi_cxx11_,pcVar5);
        }
      }
      if (local_7de != false) {
        local_4b4 = 0;
        pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP1);
        psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar6);
        pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
        f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar6);
        local_4b5 = cmsys::SystemTools::FileTimeCompare(psVar7,f2,&local_4b4);
        local_7f2 = true;
        if (((bool)local_4b5) && (local_7f2 = true, local_4b4 != 1)) {
          local_7f2 = local_4b4 == 0;
        }
        HandleBinaryOp(this,local_7f2,(int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,
                       &argP2,&local_80);
      }
      local_4c0._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP2,&local_4c0);
      local_7f3 = false;
      if (bVar2) {
        iStack_4c8 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        bVar2 = std::operator!=(&local_80,&stack0xfffffffffffffb38);
        local_7f3 = false;
        if (bVar2) {
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP2);
          local_7f3 = IsKeyword(this,&keyIN_LIST_abi_cxx11_,pcVar5);
        }
      }
      if (local_7f3 != false) {
        if ((this->Policy57Status == OLD) || (this->Policy57Status == WARN)) {
          if (this->Policy57Status == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6c8,(cmPolicies *)0x39,id);
            poVar9 = std::operator<<((ostream *)local_6a8,(string *)&local_6c8);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_6c8);
            std::operator<<((ostream *)local_6a8,
                            "IN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_6e8);
            std::__cxx11::string::~string((string *)&local_6e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
          }
        }
        else {
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
          def2 = GetVariableOrString(this,pcVar5);
          pcVar1 = this->Makefile;
          pcVar6 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&local_80);
          psVar7 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar6);
          pcVar8 = cmMakefile::GetDefinition(pcVar1,psVar7);
          if (pcVar8 != (char *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4e8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_508,pcVar8,&local_509);
            cmSystemTools::ExpandListArgument
                      (&local_508,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4e8,true);
            std::__cxx11::string::~string((string *)&local_508);
            std::allocator<char>::~allocator((allocator<char> *)&local_509);
            local_520._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_4e8);
            local_528 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_4e8);
            local_518 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                                  (local_520,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_528,&def2);
            local_530._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4e8);
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                 __gnu_cxx::operator!=(&local_518,&local_530);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4e8);
          }
          HandleBinaryOp(this,(bool)(list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (int *)(def_buf.field_2._M_local_buf + 0xc),&argP1,newArgs,&argP2,&local_80
                        );
        }
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (def_buf.field_2._12_4_ != 0);
  this_local._7_1_ = 1;
  local_31c = 1;
LAB_0089566b:
  std::__cxx11::string::~string((string *)&def);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  std::string def_buf;
  const char* def;
  const char* def2;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          IsKeyword(keyMATCHES, *argP1)) {
        def = this->GetVariableOrString(*arg);
        if (def != arg->c_str() // yes, we compare the pointer value
            && cmHasLiteralPrefix(arg->GetValue(), "CMAKE_MATCH_")) {
          // The string to match is owned by our match result variables.
          // Move it to our own buffer before clearing them.
          def_buf = def;
          def = def_buf.c_str();
        }
        const char* rex = argP2->c_str();
        this->Makefile.ClearMatches();
        cmsys::RegularExpression regEntry;
        if (!regEntry.compile(rex)) {
          std::ostringstream error;
          error << "Regular expression \"" << rex << "\" cannot compile";
          errorString = error.str();
          status = cmake::FATAL_ERROR;
          return false;
        }
        if (regEntry.find(def)) {
          this->Makefile.StoreMatches(regEntry);
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        newArgs.erase(argP2);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyMATCHES, *arg)) {
        *arg = cmExpandedCommandArgument("0", true);
        newArgs.erase(argP1);
        argP1 = arg;
        this->IncrementArguments(newArgs, argP1, argP2);
        reducible = 1;
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyLESS, *argP1) ||
           this->IsKeyword(keyLESS_EQUAL, *argP1) ||
           this->IsKeyword(keyGREATER, *argP1) ||
           this->IsKeyword(keyGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyEQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        double lhs;
        double rhs;
        bool result;
        if (sscanf(def, "%lg", &lhs) != 1 || sscanf(def2, "%lg", &rhs) != 1) {
          result = false;
        } else if (*(argP1) == keyLESS) {
          result = (lhs < rhs);
        } else if (*(argP1) == keyLESS_EQUAL) {
          result = (lhs <= rhs);
        } else if (*(argP1) == keyGREATER) {
          result = (lhs > rhs);
        } else if (*(argP1) == keyGREATER_EQUAL) {
          result = (lhs >= rhs);
        } else {
          result = (lhs == rhs);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keySTRLESS, *argP1) ||
           this->IsKeyword(keySTRLESS_EQUAL, *argP1) ||
           this->IsKeyword(keySTRGREATER, *argP1) ||
           this->IsKeyword(keySTRGREATER_EQUAL, *argP1) ||
           this->IsKeyword(keySTREQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        int val = strcmp(def, def2);
        bool result;
        if (*(argP1) == keySTRLESS) {
          result = (val < 0);
        } else if (*(argP1) == keySTRLESS_EQUAL) {
          result = (val <= 0);
        } else if (*(argP1) == keySTRGREATER) {
          result = (val > 0);
        } else if (*(argP1) == keySTRGREATER_EQUAL) {
          result = (val >= 0);
        } else // strequal
        {
          result = (val == 0);
        }
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          (this->IsKeyword(keyVERSION_LESS, *argP1) ||
           this->IsKeyword(keyVERSION_LESS_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER, *argP1) ||
           this->IsKeyword(keyVERSION_GREATER_EQUAL, *argP1) ||
           this->IsKeyword(keyVERSION_EQUAL, *argP1))) {
        def = this->GetVariableOrString(*arg);
        def2 = this->GetVariableOrString(*argP2);
        cmSystemTools::CompareOp op;
        if (*argP1 == keyVERSION_LESS) {
          op = cmSystemTools::OP_LESS;
        } else if (*argP1 == keyVERSION_LESS_EQUAL) {
          op = cmSystemTools::OP_LESS_EQUAL;
        } else if (*argP1 == keyVERSION_GREATER) {
          op = cmSystemTools::OP_GREATER;
        } else if (*argP1 == keyVERSION_GREATER_EQUAL) {
          op = cmSystemTools::OP_GREATER_EQUAL;
        } else { // version_equal
          op = cmSystemTools::OP_EQUAL;
        }
        bool result = cmSystemTools::VersionCompare(op, def, def2);
        this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
      }

      // is file A newer than file B
      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIS_NEWER_THAN, *argP1)) {
        int fileIsNewer = 0;
        bool success = cmSystemTools::FileTimeCompare(
          arg->GetValue(), (argP2)->GetValue(), &fileIsNewer);
        this->HandleBinaryOp(
          (!success || fileIsNewer == 1 || fileIsNewer == 0), reducible, arg,
          newArgs, argP1, argP2);
      }

      if (argP1 != newArgs.end() && argP2 != newArgs.end() &&
          this->IsKeyword(keyIN_LIST, *argP1)) {
        if (this->Policy57Status != cmPolicies::OLD &&
            this->Policy57Status != cmPolicies::WARN) {
          bool result = false;

          def = this->GetVariableOrString(*arg);
          def2 = this->Makefile.GetDefinition(argP2->GetValue());

          if (def2) {
            std::vector<std::string> list;
            cmSystemTools::ExpandListArgument(def2, list, true);

            result = std::find(list.begin(), list.end(), def) != list.end();
          }

          this->HandleBinaryOp(result, reducible, arg, newArgs, argP1, argP2);
        } else if (this->Policy57Status == cmPolicies::WARN) {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057) << "\n";
          e << "IN_LIST will be interpreted as an operator "
               "when the policy is set to NEW.  "
               "Since the policy is not set the OLD behavior will be used.";

          this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      }

      ++arg;
    }
  } while (reducible);
  return true;
}